

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall
TrodesMsg::TrodesMsg<char_const*,unsigned_int,std::__cxx11::string>
          (TrodesMsg *this,string *f,char *head,uint tail,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_1)

{
  TrodesMsg *in_RSI;
  string *in_R8;
  string local_78 [48];
  string local_48 [72];
  
  TrodesMsg(in_RSI);
  std::__cxx11::string::string(local_48,(string *)in_RSI);
  std::__cxx11::string::string(local_78,in_R8);
  addcontents<char_const*,unsigned_int,std::__cxx11::string>(this,f,head,tail,tail_1);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

TrodesMsg(std::string f, H head, T... tail) : TrodesMsg(){
        addcontents(f, head, tail...);
    }